

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimRecursively
          (Impl *this,int parent,int current,Prim *parentPrim,int level,
          PathIndexToSpecIndexMap *psmap,Stage *stage)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pNVar3;
  pointer pcVar4;
  uint __val;
  Type TVar5;
  char cVar6;
  bool bVar7;
  ostream *poVar8;
  long lVar9;
  pointer puVar10;
  _Base_ptr p_Var11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  size_type sVar18;
  PrimMeta *pPVar19;
  long *plVar20;
  undefined8 *puVar21;
  uint uVar22;
  _Base_ptr p_Var23;
  _Rb_tree_header *p_Var24;
  undefined1 *puVar25;
  size_type *psVar26;
  ulong uVar27;
  long *plVar28;
  ulong uVar29;
  Impl *this_00;
  pointer piVar30;
  char cVar31;
  undefined8 uVar32;
  char *pcVar33;
  uint uVar34;
  Prim *parentPrim_00;
  map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
  *this_01;
  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
  *this_02;
  uint __len;
  int *item;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  int current_local;
  int parent_local;
  size_type local_a18;
  pointer local_a10;
  Impl *local_a08;
  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
  *local_a00;
  Prim *local_9f8;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> toks;
  string variantSetName;
  string __str_1;
  string __str;
  map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
  *local_950;
  pointer local_948;
  string prop_name;
  long local_920 [10];
  ios_base local_8d0 [264];
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b8 [6];
  ios_base local_758 [976];
  optional<tinyusdz::Prim> prim;
  
  current_local = current;
  parent_local = parent;
  if ((int)(this->_config).kMaxPrimNestLevel < level) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[USDC]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xcd7);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"Prim hierarchy is too deep.",0x1b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&prim);
    if ((undefined1 *)prim._0_8_ == (undefined1 *)((long)&prim.contained + 8)) goto LAB_0018cca0;
  }
  else {
    if ((-1 < current) &&
       (current < (int)((ulong)((long)(this->_nodes).
                                      super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->_nodes).
                                     super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x41041041)
       ) {
      prim._0_8_ = prim._0_8_ & 0xffffffffffffff00;
      local_9f8 = parentPrim;
      memset(&prim.contained,0,0x350);
      p_Var1 = &(this->_variantPrims)._M_t._M_impl.super__Rb_tree_header;
      p_Var23 = (this->_variantPrims)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var11 = &p_Var1->_M_header;
      for (; p_Var23 != (_Base_ptr)0x0;
          p_Var23 = (&p_Var23->_M_left)[(int)p_Var23[1]._M_color < parent]) {
        if (parent <= (int)p_Var23[1]._M_color) {
          p_Var11 = p_Var23;
        }
      }
      p_Var23 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
         (p_Var23 = p_Var11, parent < (int)p_Var11[1]._M_color)) {
        p_Var23 = &p_Var1->_M_header;
      }
      bVar7 = ReconstructPrimNode(this,parent,current,(int)p_Var23,
                                  (_Rb_tree_header *)p_Var23 != p_Var1,psmap,stage,&prim);
      if (bVar7) {
        parentPrim_00 = (Prim *)0x0;
        if (prim.has_value_ != false) {
          parentPrim_00 = (Prim *)&prim.contained;
        }
        lVar9 = (long)current_local;
        pNVar3 = (this->_nodes).
                 super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar10 = pNVar3[lVar9]._children.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_a08 = this;
        if (*(pointer *)
             ((long)&pNVar3[lVar9]._children.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
            != puVar10) {
          uVar29 = 0;
          do {
            bVar7 = ReconstructPrimRecursively
                              (local_a08,current_local,(int)puVar10[uVar29],parentPrim_00,level + 1,
                               psmap,stage);
            if (!bVar7) goto LAB_0018dfa5;
            uVar29 = uVar29 + 1;
            puVar10 = pNVar3[lVar9]._children.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
          } while (uVar29 < (ulong)((long)*(pointer *)
                                           ((long)&pNVar3[lVar9]._children.
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + 8) - (long)puVar10 >> 3));
        }
        this_00 = local_a08;
        p_Var24 = &(local_a08->_variantPropChildren)._M_t._M_impl.super__Rb_tree_header;
        p_Var23 = (local_a08->_variantPropChildren)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent;
        p_Var11 = &p_Var24->_M_header;
        for (; p_Var23 != (_Base_ptr)0x0;
            p_Var23 = (&p_Var23->_M_left)[(int)p_Var23[1]._M_color < current_local]) {
          if (current_local <= (int)p_Var23[1]._M_color) {
            p_Var11 = p_Var23;
          }
        }
        p_Var23 = &p_Var24->_M_header;
        if (((_Rb_tree_header *)p_Var11 != p_Var24) &&
           (p_Var23 = p_Var11, current_local < (int)p_Var11[1]._M_color)) {
          p_Var23 = &p_Var24->_M_header;
        }
        this_02 = &local_a08->_variantPrims;
        if ((_Rb_tree_header *)p_Var23 == p_Var24) {
LAB_0018d3c4:
          this_00 = local_a08;
          p_Var1 = &(local_a08->_variantPrimChildren)._M_t._M_impl.super__Rb_tree_header;
          p_Var23 = (local_a08->_variantPrimChildren)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent;
          p_Var11 = &p_Var1->_M_header;
          for (; p_Var23 != (_Base_ptr)0x0;
              p_Var23 = (&p_Var23->_M_left)[(int)p_Var23[1]._M_color < current_local]) {
            if (current_local <= (int)p_Var23[1]._M_color) {
              p_Var11 = p_Var23;
            }
          }
          p_Var23 = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
             (p_Var23 = p_Var11, current_local < (int)p_Var11[1]._M_color)) {
            p_Var23 = &p_Var1->_M_header;
          }
          if ((_Rb_tree_header *)p_Var23 != p_Var1) {
            if (prim.has_value_ == false) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd52);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              pcVar33 = "Internal error: must be Prim.";
              lVar9 = 0x1d;
              goto LAB_0018df25;
            }
            pmVar13 = ::std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::at(&local_a08->_variantPrimChildren,&current_local);
            piVar30 = (pmVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            local_a10 = (pmVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            if (piVar30 != local_a10) {
              local_a00 = this_02;
              do {
                sVar18 = ::std::
                         map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                         ::count(this_02,piVar30);
                if (sVar18 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
                  poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd5b);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  pcVar33 = "Internal error: variant Prim children not found.";
                  lVar9 = 0x30;
                  goto LAB_0018df25;
                }
                pmVar12 = ::std::
                          map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                          ::at(this_02,piVar30);
                bVar7 = is_variantElementName((string *)&pmVar12->_elementPath);
                if (!bVar7) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
                  poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd64);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  pcVar33 = "Corrupted Crate. Variant Prim has invalid element_name.";
                  lVar9 = 0x37;
                  goto LAB_0018df25;
                }
                lVar9 = 0x10;
                do {
                  puVar25 = (undefined1 *)((long)local_920 + lVar9 + -0x20);
                  *(undefined1 **)((long)&local_950 + lVar9) = puVar25;
                  *(undefined8 *)((long)&local_948 + lVar9) = 0;
                  *puVar25 = 0;
                  lVar9 = lVar9 + 0x20;
                } while (lVar9 != 0x50);
                bVar7 = tokenize_variantElement
                                  ((string *)&pmVar12->_elementPath,
                                   (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                    *)&prop_name);
                local_a18 = CONCAT71(local_a18._1_7_,bVar7);
                if (bVar7) {
                  _ss_e = (pointer)local_7b8;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&ss_e,prop_name._M_dataplus._M_p,
                             prop_name._M_dataplus._M_p + prop_name._M_string_length);
                  toks._M_elems[0]._M_dataplus._M_p = (pointer)&toks._M_elems[0].field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&toks,local_920[0],local_920[1] + local_920[0]);
                  if (prim.has_value_ == false) {
                    __assert_fail("has_value()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                                  ,0x550,
                                  "value_type *nonstd::optional_lite::optional<tinyusdz::Prim>::operator->() [T = tinyusdz::Prim]"
                                 );
                  }
                  pmVar16 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                                          *)((long)&prim.contained + 800),(key_type *)&ss_e);
                  if ((pmVar16->name)._M_string_length == 0) {
                    ::std::__cxx11::string::_M_assign((string *)pmVar16);
                  }
                  pPVar19 = Prim::metas(pmVar12);
                  pmVar17 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                                          *)&pmVar16->variantSet,toks._M_elems);
                  PrimMetas::operator=(&pmVar17->_metas,pPVar19);
                  pmVar17 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                                          *)&pmVar16->variantSet,toks._M_elems);
                  std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator=
                            (&pmVar17->_primChildren,&pmVar12->_children);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)toks._M_elems[0]._M_dataplus._M_p != &toks._M_elems[0].field_2) {
                    operator_delete(toks._M_elems[0]._M_dataplus._M_p,
                                    toks._M_elems[0].field_2._M_allocated_capacity + 1);
                  }
                  this_02 = local_a00;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_ss_e != local_7b8) {
                    operator_delete(_ss_e,(ulong)(local_7b8[0]._M_allocated_capacity + 1));
                  }
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
                  poVar8 = (ostream *)::std::ostream::operator<<((key_type *)&ss_e,0xd69);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,"Invalid variant element_name.",0x1d);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  PushError(this_00,toks._M_elems);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)toks._M_elems[0]._M_dataplus._M_p != &toks._M_elems[0].field_2) {
                    operator_delete(toks._M_elems[0]._M_dataplus._M_p,
                                    toks._M_elems[0].field_2._M_allocated_capacity + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  ::std::ios_base::~ios_base(local_758);
                }
                cVar31 = (char)local_a18;
                lVar9 = -0x40;
                plVar20 = local_920 + 2;
                do {
                  if (plVar20 != (long *)plVar20[-2]) {
                    operator_delete((long *)plVar20[-2],*plVar20 + 1);
                  }
                  plVar20 = plVar20 + -4;
                  lVar9 = lVar9 + 0x20;
                } while (lVar9 != 0);
                if (cVar31 == '\0') goto LAB_0018dfa5;
                piVar30 = piVar30 + 1;
                this_00 = local_a08;
              } while (piVar30 != local_a10);
            }
          }
          if (parent_local == 0) {
            bVar7 = true;
            if (prim.has_value_ != true) goto LAB_0018dfa7;
          }
          else {
            sVar18 = ::std::
                     map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                     ::count(this_02,&parent_local);
            if (sVar18 != 0) {
              if (prim.has_value_ == false) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&ss_e,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd85);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&ss_e,"parent is variantPrim, but current is not Prim.",0x2f);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
                ::std::__cxx11::stringbuf::str();
                PushWarn(this_00,&prop_name);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
                  operator_delete(prop_name._M_dataplus._M_p,
                                  prop_name.field_2._M_allocated_capacity + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                ::std::ios_base::~ios_base(local_758);
              }
              else {
                pmVar12 = ::std::
                          map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                          ::at(this_02,&parent_local);
                if (prim.has_value_ == false) {
                  __assert_fail("has_value()",
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                                ,0x591,
                                "value_type &nonstd::optional_lite::optional<tinyusdz::Prim>::value() [T = tinyusdz::Prim]"
                               );
                }
                ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::
                emplace_back<tinyusdz::Prim>
                          ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)
                           &pmVar12->_children,(Prim *)&prim.contained);
              }
              bVar7 = true;
              goto LAB_0018dfa7;
            }
            bVar7 = true;
            if (local_9f8 == (Prim *)0x0 || prim.has_value_ != true) goto LAB_0018dfa7;
            stage = (Stage *)&local_9f8->_children;
          }
          bVar7 = true;
          ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::
          emplace_back<tinyusdz::Prim>(&stage->_root_nodes,(Prim *)&prim.contained);
          goto LAB_0018dfa7;
        }
        p_Var23 = (local_a08->_variantPrims)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var23 != (_Rb_tree_header *)0x0;
            p_Var23 = (&p_Var23->_M_left)[(int)*(size_t *)(p_Var23 + 1) < current_local]) {
          if (current_local <= (int)*(size_t *)(p_Var23 + 1)) {
            p_Var11 = p_Var23;
          }
        }
        p_Var24 = p_Var1;
        if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
           (p_Var24 = (_Rb_tree_header *)p_Var11,
           current_local < (int)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
          p_Var24 = p_Var1;
        }
        if (p_Var24 == p_Var1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd1b);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          pcVar33 = "Internal error: variant attribute is not a child of VariantPrim.";
          lVar9 = 0x40;
        }
        else if (local_9f8 == (Prim *)0x0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd1f);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          pcVar33 = "Internal error: parentPrim should exist.";
          lVar9 = 0x28;
        }
        else {
          pmVar12 = ::std::
                    map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                    ::at(this_02,&current_local);
          bVar7 = is_variantElementName((string *)&pmVar12->_elementPath);
          if (bVar7) {
            lVar9 = 0x10;
            do {
              puVar25 = (undefined1 *)((long)&toks._M_elems[0]._M_dataplus._M_p + lVar9);
              *(undefined1 **)((long)&local_a00 + lVar9) = puVar25;
              *(undefined8 *)((long)toks._M_elems + lVar9 + -8) = 0;
              *puVar25 = 0;
              lVar9 = lVar9 + 0x20;
            } while (lVar9 != 0x50);
            bVar7 = tokenize_variantElement((string *)&pmVar12->_elementPath,&toks);
            if (bVar7) {
              variantSetName._M_dataplus._M_p = (pointer)&variantSetName.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&variantSetName,toks._M_elems[0]._M_dataplus._M_p,
                         toks._M_elems[0]._M_dataplus._M_p + toks._M_elems[0]._M_string_length);
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&__str,toks._M_elems[1]._M_dataplus._M_p,
                         toks._M_elems[1]._M_dataplus._M_p + toks._M_elems[1]._M_string_length);
              Variant::Variant((Variant *)&ss_e);
              pmVar13 = ::std::
                        map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                        ::at(&this_00->_variantPropChildren,&current_local);
              piVar30 = (pmVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              local_948 = (pmVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
              local_a10 = (pointer)CONCAT71(local_a10._1_7_,piVar30 == local_948);
              if (piVar30 != local_948) {
                this_01 = &this_00->_variantProps;
                local_a00 = this_02;
                local_950 = this_01;
                do {
                  local_a18 = ::std::
                              map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                              ::count(this_01,piVar30);
                  if (local_a18 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&prop_name);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&prop_name,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&prop_name,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                               ,0x55);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&prop_name,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&prop_name,"ReconstructPrimRecursively",0x1a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&prop_name,"():",3);
                    poVar8 = (ostream *)::std::ostream::operator<<(&prop_name,0xd39);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&prop_name,"Internal error: variant Property not found.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&prop_name,"\n",1);
                    ::std::__cxx11::stringbuf::str();
                    PushError(this_00,&__str_1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
                      operator_delete(__str_1._M_dataplus._M_p,
                                      __str_1.field_2._M_allocated_capacity + 1);
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prop_name);
                    ::std::ios_base::~ios_base(local_8d0);
                  }
                  else {
                    pmVar14 = ::std::
                              map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                              ::at(this_01,piVar30);
                    prop_name._M_dataplus._M_p = (pointer)&prop_name.field_2;
                    pcVar4 = (pmVar14->first)._prop_part._M_dataplus._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&prop_name,pcVar4,
                               pcVar4 + (pmVar14->first)._prop_part._M_string_length);
                    pmVar15 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                            *)&ss_e,&prop_name);
                    ::std::__cxx11::string::_M_assign((string *)pmVar15);
                    (pmVar15->_attrib)._varying_authored =
                         (pmVar14->second)._attrib._varying_authored;
                    (pmVar15->_attrib)._variability = (pmVar14->second)._attrib._variability;
                    ::std::__cxx11::string::_M_assign((string *)&(pmVar15->_attrib)._type_name);
                    linb::any::operator=
                              ((any *)&(pmVar15->_attrib)._var,
                               (any *)&(pmVar14->second)._attrib._var);
                    (pmVar15->_attrib)._var._blocked = (pmVar14->second)._attrib._var._blocked;
                    ::std::
                    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 *)&(pmVar15->_attrib)._var._ts,
                                (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 *)&(pmVar14->second)._attrib._var._ts);
                    (pmVar15->_attrib)._var._ts._dirty = (pmVar14->second)._attrib._var._ts._dirty;
                    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                              (&(pmVar15->_attrib)._paths,&(pmVar14->second)._attrib._paths);
                    AttrMetas::operator=
                              (&(pmVar15->_attrib)._metas,&(pmVar14->second)._attrib._metas);
                    TVar5 = (pmVar14->second)._type;
                    pmVar15->_listOpQual = (pmVar14->second)._listOpQual;
                    pmVar15->_type = TVar5;
                    (pmVar15->_rel).type = (pmVar14->second)._rel.type;
                    Path::operator=(&(pmVar15->_rel).targetPath,&(pmVar14->second)._rel.targetPath);
                    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                              (&(pmVar15->_rel).targetPathVector,
                               &(pmVar14->second)._rel.targetPathVector);
                    (pmVar15->_rel).listOpQual = (pmVar14->second)._rel.listOpQual;
                    AttrMetas::operator=(&(pmVar15->_rel)._metas,&(pmVar14->second)._rel._metas);
                    (pmVar15->_rel)._varying_authored = (pmVar14->second)._rel._varying_authored;
                    ::std::__cxx11::string::_M_assign((string *)&pmVar15->_prop_value_type_name);
                    pmVar15->_has_custom = (pmVar14->second)._has_custom;
                    this_01 = local_950;
                    this_02 = local_a00;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
                      operator_delete(prop_name._M_dataplus._M_p,
                                      prop_name.field_2._M_allocated_capacity + 1);
                      this_01 = local_950;
                      this_02 = local_a00;
                    }
                  }
                  if (local_a18 == 0) goto LAB_0018d336;
                  piVar30 = piVar30 + 1;
                  local_a10 = (pointer)CONCAT71(local_a10._1_7_,piVar30 == local_948);
                } while (piVar30 != local_948);
              }
              pmVar16 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                                      *)&local_9f8->_variantSets,&variantSetName);
              if ((pmVar16->name)._M_string_length == 0) {
                ::std::__cxx11::string::_M_assign((string *)pmVar16);
              }
              pmVar17 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                                      *)&pmVar16->variantSet,&__str);
              Variant::operator=(pmVar17,(Variant *)&ss_e);
LAB_0018d336:
              Variant::~Variant((Variant *)&ss_e);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)variantSetName._M_dataplus._M_p != &variantSetName.field_2) {
                operator_delete(variantSetName._M_dataplus._M_p,
                                variantSetName.field_2._M_allocated_capacity + 1);
              }
              lVar9 = -0x40;
              paVar35 = &toks._M_elems[1].field_2;
              do {
                plVar20 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(paVar35 + -1))->_M_dataplus)._M_p;
                if (paVar35 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar20) {
                  operator_delete(plVar20,paVar35->_M_allocated_capacity + 1);
                }
                paVar35 = paVar35 + -2;
                lVar9 = lVar9 + 0x20;
              } while (lVar9 != 0);
              if (((ulong)local_a10 & 1) != 0) goto LAB_0018d3c4;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd2e);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e,"Invalid variant element_name.",0x1d);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
              ::std::__cxx11::stringbuf::str();
              PushError(this_00,&prop_name);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
                operator_delete(prop_name._M_dataplus._M_p,
                                prop_name.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              ::std::ios_base::~ios_base(local_758);
              lVar9 = -0x40;
              paVar35 = &toks._M_elems[1].field_2;
              do {
                plVar20 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(paVar35 + -1))->_M_dataplus)._M_p;
                if (paVar35 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar20) {
                  operator_delete(plVar20,paVar35->_M_allocated_capacity + 1);
                }
                paVar35 = paVar35 + -2;
                lVar9 = lVar9 + 0x20;
              } while (lVar9 != 0);
            }
            goto LAB_0018dfa5;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd29);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          pcVar33 = "Corrupted Crate. VariantAttribute is not the child of VariantPrim.";
          lVar9 = 0x42;
        }
LAB_0018df25:
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,pcVar33,lVar9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this_00,&prop_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
          operator_delete(prop_name._M_dataplus._M_p,prop_name.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        ::std::ios_base::~ios_base(local_758);
      }
LAB_0018dfa5:
      bVar7 = false;
LAB_0018dfa7:
      if (prim.has_value_ != true) {
        return bVar7;
      }
      Prim::~Prim((Prim *)&prim.contained);
      return bVar7;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xce0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    __val = -current_local;
    if (0 < current_local) {
      __val = current_local;
    }
    __len = 1;
    if (9 < __val) {
      uVar29 = (ulong)__val;
      uVar34 = 4;
      do {
        __len = uVar34;
        uVar22 = (uint)uVar29;
        if (uVar22 < 100) {
          __len = __len - 2;
          goto LAB_0018d8bb;
        }
        if (uVar22 < 1000) {
          __len = __len - 1;
          goto LAB_0018d8bb;
        }
        if (uVar22 < 10000) goto LAB_0018d8bb;
        uVar29 = uVar29 / 10000;
        uVar34 = __len + 4;
      } while (99999 < uVar22);
      __len = __len + 1;
    }
LAB_0018d8bb:
    uVar34 = (uint)current_local >> 0x1f;
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&__str,(char)__len - (char)(current_local >> 0x1f));
    ::std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p + uVar34,__len,__val);
    plVar20 = (long *)::std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x3b642a);
    psVar26 = (size_type *)(plVar20 + 2);
    if ((size_type *)*plVar20 == psVar26) {
      variantSetName.field_2._M_allocated_capacity = *psVar26;
      variantSetName.field_2._8_8_ = plVar20[3];
      variantSetName._M_dataplus._M_p = (pointer)&variantSetName.field_2;
    }
    else {
      variantSetName.field_2._M_allocated_capacity = *psVar26;
      variantSetName._M_dataplus._M_p = (pointer)*plVar20;
    }
    variantSetName._M_string_length = plVar20[1];
    *plVar20 = (long)psVar26;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    plVar20 = (long *)::std::__cxx11::string::append((char *)&variantSetName);
    paVar35 = &toks._M_elems[0].field_2;
    psVar26 = (size_type *)(plVar20 + 2);
    if ((size_type *)*plVar20 == psVar26) {
      toks._M_elems[0].field_2._M_allocated_capacity = *psVar26;
      toks._M_elems[0].field_2._8_8_ = plVar20[3];
      toks._M_elems[0]._M_dataplus._M_p = (pointer)paVar35;
    }
    else {
      toks._M_elems[0].field_2._M_allocated_capacity = *psVar26;
      toks._M_elems[0]._M_dataplus._M_p = (pointer)*plVar20;
    }
    toks._M_elems[0]._M_string_length = plVar20[1];
    *plVar20 = (long)psVar26;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    uVar29 = ((long)(this->_nodes).
                    super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_nodes).
                    super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1041041041041041;
    cVar31 = '\x01';
    if (9 < uVar29) {
      uVar27 = uVar29;
      cVar6 = '\x04';
      do {
        cVar31 = cVar6;
        if (uVar27 < 100) {
          cVar31 = cVar31 + -2;
          goto LAB_0018da2c;
        }
        if (uVar27 < 1000) {
          cVar31 = cVar31 + -1;
          goto LAB_0018da2c;
        }
        if (uVar27 < 10000) goto LAB_0018da2c;
        bVar7 = 99999 < uVar27;
        uVar27 = uVar27 / 10000;
        cVar6 = cVar31 + '\x04';
      } while (bVar7);
      cVar31 = cVar31 + '\x01';
    }
LAB_0018da2c:
    paVar2 = &__str_1.field_2;
    __str_1._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct((ulong)&__str_1,cVar31);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar29);
    uVar29 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
             toks._M_elems[0]._M_string_length;
    uVar32 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)toks._M_elems[0]._M_dataplus._M_p != paVar35) {
      uVar32 = toks._M_elems[0].field_2._M_allocated_capacity;
    }
    if ((ulong)uVar32 < uVar29) {
      uVar32 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar2) {
        uVar32 = __str_1.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar32 < uVar29) goto LAB_0018da9e;
      puVar21 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&__str_1,0,(char *)0x0,(ulong)toks._M_elems[0]._M_dataplus._M_p);
    }
    else {
LAB_0018da9e:
      puVar21 = (undefined8 *)
                ::std::__cxx11::string::_M_append((char *)&toks,(ulong)__str_1._M_dataplus._M_p);
    }
    prop_name._M_dataplus._M_p = (pointer)&prop_name.field_2;
    psVar26 = puVar21 + 2;
    if ((size_type *)*puVar21 == psVar26) {
      prop_name.field_2._M_allocated_capacity = *psVar26;
      prop_name.field_2._8_8_ = puVar21[3];
    }
    else {
      prop_name.field_2._M_allocated_capacity = *psVar26;
      prop_name._M_dataplus._M_p = (pointer)*puVar21;
    }
    prop_name._M_string_length = puVar21[1];
    *puVar21 = psVar26;
    puVar21[1] = 0;
    *(char *)psVar26 = '\0';
    plVar20 = (long *)::std::__cxx11::string::append((char *)&prop_name);
    puVar25 = (undefined1 *)((long)&prim.contained + 8);
    plVar28 = plVar20 + 2;
    if ((long *)*plVar20 == plVar28) {
      prim.contained._8_8_ = *plVar28;
      prim.contained._16_8_ = plVar20[3];
      prim._0_8_ = puVar25;
    }
    else {
      prim.contained._8_8_ = *plVar28;
      prim._0_8_ = (long *)*plVar20;
    }
    prim.contained.data.__align = *(anon_struct_8_0_00000001_for___align *)(plVar20 + 1);
    *plVar20 = (long)plVar28;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&ss_e,(char *)prim._0_8_,(long)prim.contained.data._0_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    if ((undefined1 *)prim._0_8_ != puVar25) {
      operator_delete((void *)prim._0_8_,prim.contained._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
      operator_delete(prop_name._M_dataplus._M_p,prop_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar2) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)toks._M_elems[0]._M_dataplus._M_p != paVar35) {
      operator_delete(toks._M_elems[0]._M_dataplus._M_p,
                      toks._M_elems[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)variantSetName._M_dataplus._M_p != &variantSetName.field_2) {
      operator_delete(variantSetName._M_dataplus._M_p,
                      variantSetName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&prim);
    if ((undefined1 *)prim._0_8_ == puVar25) goto LAB_0018cca0;
  }
  operator_delete((void *)prim._0_8_,prim.contained._8_8_ + 1);
LAB_0018cca0:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  ::std::ios_base::~ios_base(local_758);
  return false;
}

Assistant:

bool USDCReader::Impl::ReconstructPrimRecursively(
    int parent, int current, Prim *parentPrim, int level,
    const PathIndexToSpecIndexMap &psmap, Stage *stage) {
  if (level > int32_t(_config.kMaxPrimNestLevel)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Prim hierarchy is too deep.");
  }

  DCOUT("ReconstructPrimRecursively: parent = "
        << std::to_string(parent) << ", current = " << current
        << ", level = " << std::to_string(level));

  if ((current < 0) || (current >= int(_nodes.size()))) {
    PUSH_ERROR("Invalid current node id: " + std::to_string(current) +
               ". Must be in range [0, " + std::to_string(_nodes.size()) + ")");
    return false;
  }

  //
  // TODO: Use bottom-up reconstruction(traverse child first)
  //

  // null : parent node is Property or other Spec type.
  // non-null : parent node is Prim
  Prim *currPrimPtr = nullptr;
  nonstd::optional<Prim> prim;

  bool is_parent_variant = _variantPrims.count(parent);

  if (!ReconstructPrimNode(parent, current, level, is_parent_variant, psmap,
                           stage, &prim)) {
    return false;
  }

  if (prim) {
    currPrimPtr = &(prim.value());
  }

  // Traverse children
  {
    const crate::CrateReader::Node &node = _nodes[size_t(current)];
    DCOUT("node.Children.size = " << node.GetChildren().size());
    for (size_t i = 0; i < node.GetChildren().size(); i++) {
      DCOUT("Reconstuct Prim children: " << i << " / "
                                         << node.GetChildren().size());
      if (!ReconstructPrimRecursively(current, int(node.GetChildren()[i]),
                                      currPrimPtr, level + 1, psmap, stage)) {
        return false;
      }
      DCOUT("DONE Reconstuct Prim children: " << i << " / "
                                              << node.GetChildren().size());
    }
  }

  //
  // Reonstruct variant
  //
  DCOUT(fmt::format("parent {}, current {}", parent, current));

  DCOUT(fmt::format("  has variant properties {}, has variant children {}",
    _variantPropChildren.count(current),
    _variantPrimChildren.count(current)));

  if (_variantPropChildren.count(current)) {

    // - parentPrim
    //   - variantPrim(SpecTypeVariant) <- current
    //     - variant property(SpecTypeAttribute)

    //
    // `current` must be VariantPrim and `parentPrim` should exist
    //
    if (!_variantPrims.count(current)) {
      PUSH_ERROR_AND_RETURN("Internal error: variant attribute is not a child of VariantPrim.");
    }

    if (!parentPrim) {
      PUSH_ERROR_AND_RETURN("Internal error: parentPrim should exist.");
    }

    const Prim &variantPrim = _variantPrims.at(current);

    DCOUT("variant prim name: " << variantPrim.element_name());


    // element_name must be variant: "{variant=value}"
    if (!is_variantElementName(variantPrim.element_name())) {
      PUSH_ERROR_AND_RETURN("Corrupted Crate. VariantAttribute is not the child of VariantPrim.");
    }

    std::array<std::string, 2> toks;
    if (!tokenize_variantElement(variantPrim.element_name(), &toks)) {
      PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
    }

    std::string variantSetName = toks[0];
    std::string variantName = toks[1];

    Variant variant;

    for (const auto &item : _variantPropChildren.at(current)) {
      // item should exist in _variantProps.
      if (!_variantProps.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Property not found.");
      }
      const std::pair<Path, Property> &pp = _variantProps.at(item);

      std::string prop_name = std::get<0>(pp).prop_part();
      DCOUT(fmt::format("  node_index = {}, prop name {}", item, prop_name));

      variant.properties()[prop_name] = std::get<1>(pp);
    }

    VariantSet &vs = parentPrim->variantSets()[variantSetName];

    if (vs.name.empty()) {
      vs.name = variantSetName;
    }
    vs.variantSet[variantName] = variant;

  }

  if (_variantPrimChildren.count(current)) {

    // - currentPrim <- current
    //   - variant Prim children

    if (!prim) {
      PUSH_ERROR_AND_RETURN("Internal error: must be Prim.");
    }

    DCOUT(fmt::format("{} has variant Prim ", prim->element_name()));


    for (const auto &item : _variantPrimChildren.at(current)) {

      if (!_variantPrims.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Prim children not found.");
      }

      const Prim &vp = _variantPrims.at(item);

      DCOUT(fmt::format("  variantPrim name {}", vp.element_name()));

      // element_name must be variant: "{variant=value}"
      if (!is_variantElementName(vp.element_name())) {
        PUSH_ERROR_AND_RETURN("Corrupted Crate. Variant Prim has invalid element_name.");
      }

      std::array<std::string, 2> toks;
      if (!tokenize_variantElement(vp.element_name(), &toks)) {
        PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
      }

      std::string variantSetName = toks[0];
      std::string variantName = toks[1];

      VariantSet &vs = prim->variantSets()[variantSetName];

      if (vs.name.empty()) {
        vs.name = variantSetName;
      }
      vs.variantSet[variantName].metas() = vp.metas();
      DCOUT("# of primChildren = " << vp.children().size());
      vs.variantSet[variantName].primChildren() = std::move(vp.children());

    }
  }

  if (parent == 0) {  // root prim
    if (prim) {
      stage->root_prims().emplace_back(std::move(prim.value()));
    }
  } else {
    if (_variantPrims.count(parent)) {
      // Add to variantPrim
      DCOUT("parent is variantPrim: " << parent);
      if (!prim) {
        // FIXME: Validate current should be Prim.
        PUSH_WARN("parent is variantPrim, but current is not Prim.");
      } else {
        DCOUT("Adding prim to child...");
        Prim &vp = _variantPrims.at(parent);
        vp.children().emplace_back(std::move(prim.value()));
      }
    } else if (prim && parentPrim) {
      // Add to parent prim.
      parentPrim->children().emplace_back(std::move(prim.value()));
    }
  }

  return true;
}